

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O0

void __thiscall henson::Coroutine<henson::Puppet>::~Coroutine(Coroutine<henson::Puppet> *this)

{
  long in_RDI;
  
  coro_stack_free(in_RDI + 0x40);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x2e344c);
  BaseCoroutine::~BaseCoroutine((BaseCoroutine *)0x2e3456);
  return;
}

Assistant:

~Coroutine()
                        {
#ifndef USE_BOOST
                            coro_stack_free(&stack_);
#endif
                        }